

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O0

value_type_conflict4 __thiscall
lineage::NegativeLogProbabilityRatio<double>::operator()
          (NegativeLogProbabilityRatio<double> *this,value_type_conflict4 x)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double local_10;
  
  if (*in_RDI <= in_XMM0_Qa) {
    local_10 = in_XMM0_Qa;
    if (in_RDI[1] <= in_XMM0_Qa && in_XMM0_Qa != in_RDI[1]) {
      local_10 = in_RDI[1];
    }
  }
  else {
    local_10 = *in_RDI;
  }
  dVar1 = log((1.0 - local_10) / local_10);
  return dVar1;
}

Assistant:

value_type operator()(value_type x) const
        {
            assert(.0 <= x && x <= 1.0);
            if(x < epsilon_) {
                x = epsilon_;
            }
            else if(x > oneMinusEpsilon_) {
                x = oneMinusEpsilon_;
            }
            return std::log( (1.0 - x) / x );
        }